

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::Simulator(Simulator *this,Generator *generator)

{
  __node_base_ptr *__ht;
  __node_base_ptr *__ht_00;
  undefined1 local_100 [8];
  DependencyVisitor visitor;
  
  (this->values_)._M_h._M_buckets = &(this->values_)._M_h._M_single_bucket;
  (this->values_)._M_h._M_bucket_count = 1;
  (this->values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->values_)._M_h._M_element_count = 0;
  (this->values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->complex_values_)._M_h._M_buckets = &(this->complex_values_)._M_h._M_single_bucket;
  (this->complex_values_)._M_h._M_bucket_count = 1;
  (this->complex_values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->complex_values_)._M_h._M_element_count = 0;
  (this->complex_values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->complex_values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->complex_values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->event_queue_).c.
  super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
                       *)&this->event_queue_,0);
  (this->dependency_)._M_h._M_buckets = &(this->dependency_)._M_h._M_single_bucket;
  (this->dependency_)._M_h._M_bucket_count = 1;
  (this->dependency_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dependency_)._M_h._M_element_count = 0;
  (this->dependency_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dependency_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dependency_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->linked_dependency_)._M_h._M_buckets = &(this->linked_dependency_)._M_h._M_single_bucket;
  (this->linked_dependency_)._M_h._M_bucket_count = 1;
  (this->linked_dependency_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->linked_dependency_)._M_h._M_element_count = 0;
  (this->linked_dependency_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->linked_dependency_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->linked_dependency_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scope_)._M_h._M_buckets = &(this->scope_)._M_h._M_single_bucket;
  (this->scope_)._M_h._M_bucket_count = 1;
  (this->scope_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scope_)._M_h._M_element_count = 0;
  (this->scope_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scope_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scope_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nba_values_)._M_h._M_buckets = &(this->nba_values_)._M_h._M_single_bucket;
  (this->nba_values_)._M_h._M_bucket_count = 1;
  (this->nba_values_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nba_values_)._M_h._M_element_count = 0;
  (this->nba_values_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nba_values_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nba_values_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->simulation_depth_ = 0;
  if (generator != (Generator *)0x0) {
    visitor.linked_dependency_._M_h._M_single_bucket = (__node_base_ptr)&this->event_queue_;
    fix_assignment_type(generator);
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_100 = (undefined1  [8])&PTR_visit_root_002b5ae8;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.dependency_._M_h._M_rehash_policy._M_next_resize;
    visitor.dependency_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.dependency_._M_h._M_bucket_count = 0;
    visitor.dependency_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.dependency_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.dependency_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.dependency_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.dependency_._M_h._M_rehash_policy._M_next_resize = 0;
    visitor.dependency_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.linked_dependency_._M_h._M_rehash_policy._M_next_resize;
    visitor.linked_dependency_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.linked_dependency_._M_h._M_bucket_count = 0;
    visitor.linked_dependency_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.linked_dependency_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.linked_dependency_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.linked_dependency_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.linked_dependency_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_generator_root_p((IRVisitor *)local_100,generator);
    __ht_00 = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
    if ((unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
         *)__ht_00 != &this->dependency_) {
      std::
      _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->dependency_,
                 (_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)__ht_00);
    }
    __ht = &visitor.dependency_._M_h._M_single_bucket;
    if ((unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
         *)__ht != &this->linked_dependency_) {
      std::
      _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->linked_dependency_,
                 (_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)__ht);
    }
    init_pull_up_value(this,generator);
    local_100 = (undefined1  [8])&PTR_visit_root_002b5ae8;
    std::
    _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)__ht);
    std::
    _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)__ht_00);
    local_100 = (undefined1  [8])&PTR_visit_root_002b4518;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

Simulator::Simulator(kratos::Generator *generator) {
    if (!generator) return;
    // fix the assignment type
    fix_assignment_type(generator);
    // compute the dependency
    DependencyVisitor visitor;
    // visit in parallel to build up and dep table
    visitor.visit_generator_root_p(generator);
    dependency_ = visitor.dependency();
    linked_dependency_ = visitor.linked_dependency();
    init_pull_up_value(generator);
}